

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int maybe_new_socket(uv_tcp_t *handle,int domain,int flags)

{
  int fd;
  int iVar1;
  int iVar2;
  
  if ((domain == 0) || ((handle->io_watcher).fd != -1)) {
    handle->flags = handle->flags | flags;
    iVar2 = 0;
  }
  else {
    fd = uv__socket(domain,1,0);
    iVar2 = fd;
    if ((-1 < fd) &&
       (iVar1 = uv__stream_open((uv_stream_t *)handle,fd,flags), iVar2 = 0, iVar1 != 0)) {
      uv__close(fd);
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, unsigned long flags) {
  struct sockaddr_storage saddr;
  socklen_t slen;

  if (domain == AF_UNSPEC) {
    handle->flags |= flags;
    return 0;
  }

  if (uv__stream_fd(handle) != -1) {

    if (flags & UV_HANDLE_BOUND) {

      if (handle->flags & UV_HANDLE_BOUND) {
        /* It is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Query to see if tcp socket is bound. */
      slen = sizeof(saddr);
      memset(&saddr, 0, sizeof(saddr));
      if (getsockname(uv__stream_fd(handle), (struct sockaddr*) &saddr, &slen))
        return UV__ERR(errno);

      if ((saddr.ss_family == AF_INET6 &&
          ((struct sockaddr_in6*) &saddr)->sin6_port != 0) ||
          (saddr.ss_family == AF_INET &&
          ((struct sockaddr_in*) &saddr)->sin_port != 0)) {
        /* Handle is already bound to a port. */
        handle->flags |= flags;
        return 0;
      }

      /* Bind to arbitrary port */
      if (bind(uv__stream_fd(handle), (struct sockaddr*) &saddr, slen))
        return UV__ERR(errno);
    }

    handle->flags |= flags;
    return 0;
  }

  return new_socket(handle, domain, flags);
}